

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O0

void __thiscall
GlobOpt::ToVar(GlobOpt *this,BVSparse<Memory::JitArenaAllocator> *bv,BasicBlock *block,
              Instr *insertBeforeInstr)

{
  bool bVar1;
  SymID id_00;
  StackSym *sym;
  RegOpnd *regOpnd;
  Instr *this_00;
  Opnd *pOVar2;
  RegOpnd *pRVar3;
  Instr *lastNextInstr;
  Opnd *src2;
  Opnd *src1;
  Instr *lastInstr;
  RegOpnd *newOpnd;
  StackSym *stackSym;
  SparseBVUnit _unit;
  BVIndex _startIndex;
  BVIndex _offset;
  BVSparseNode<Memory::JitArenaAllocator> *_curNode;
  BVIndex id;
  Instr *insertBeforeInstr_local;
  BasicBlock *block_local;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  GlobOpt *this_local;
  
  __startIndex = bv->head;
  while( true ) {
    if (__startIndex == (Type_conflict)0x0) {
      return;
    }
    _unit.word._0_4_ = __startIndex->startIndex;
    stackSym = (StackSym *)(__startIndex->data).word;
    _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
    while (_unit.word._4_4_ != 0xffffffff) {
      id_00 = (Type)_unit.word + _unit.word._4_4_;
      BVUnitT<unsigned_long>::Clear((BVUnitT<unsigned_long> *)&stackSym,_unit.word._4_4_);
      sym = SymTable::FindStackSym(this->func->m_symTable,id_00);
      regOpnd = IR::RegOpnd::New(sym,TyVar,this->func);
      this_00 = BasicBlock::GetLastInstr(block);
      if (insertBeforeInstr == (Instr *)0x0) {
        bVar1 = IR::Instr::IsBranchInstr(this_00);
        if ((bVar1) || (this_00->m_opcode == BailTarget)) {
          pOVar2 = IR::Instr::GetSrc1(this_00);
          if (pOVar2 != (Opnd *)0x0) {
            bVar1 = IR::Opnd::IsRegOpnd(pOVar2);
            if ((bVar1) && (pRVar3 = IR::Opnd::AsRegOpnd(pOVar2), pRVar3->m_sym == sym)) {
              IR::Instr::HoistSrc1(this_00,Ld_A,RegNOREG,(StackSym *)0x0);
            }
            pOVar2 = IR::Instr::GetSrc2(this_00);
            if (((pOVar2 != (Opnd *)0x0) && (bVar1 = IR::Opnd::IsRegOpnd(pOVar2), bVar1)) &&
               (pRVar3 = IR::Opnd::AsRegOpnd(pOVar2), pRVar3->m_sym == sym)) {
              IR::Instr::HoistSrc2(this_00,Ld_A,RegNOREG,(StackSym *)0x0);
            }
          }
          ToVar(this,this_00,regOpnd,block,(Value *)0x0,false);
        }
        else {
          ToVar(this,this_00->m_next,regOpnd,block,(Value *)0x0,false);
        }
      }
      else {
        ToVar(this,insertBeforeInstr,regOpnd,block,(Value *)0x0,false);
      }
      _unit.word._4_4_ = BVUnitT<unsigned_long>::GetNextBit((BVUnitT<unsigned_long> *)&stackSym);
    }
    if (__startIndex == (Type_conflict)0x0) break;
    __startIndex = __startIndex->next;
  }
  return;
}

Assistant:

void
GlobOpt::ToVar(BVSparse<JitArenaAllocator> *bv, BasicBlock *block, IR::Instr* insertBeforeInstr /* = nullptr */)
{
    FOREACH_BITSET_IN_SPARSEBV(id, bv)
    {
        StackSym *stackSym = this->func->m_symTable->FindStackSym(id);
        IR::RegOpnd *newOpnd = IR::RegOpnd::New(stackSym, TyVar, this->func);
        IR::Instr* lastInstr = block->GetLastInstr();

        if (insertBeforeInstr != nullptr)
        {
            this->ToVar(insertBeforeInstr, newOpnd, block, nullptr, false);
        }
        else if (lastInstr->IsBranchInstr() || lastInstr->m_opcode == Js::OpCode::BailTarget)
        {
            // If branch is using this symbol, hoist the operand as the ToVar load will get
            // inserted right before the branch.
            IR::Opnd *src1 = lastInstr->GetSrc1();
            if (src1)
            {
                if (src1->IsRegOpnd() && src1->AsRegOpnd()->m_sym == stackSym)
                {
                    lastInstr->HoistSrc1(Js::OpCode::Ld_A);
                }
                IR::Opnd *src2 = lastInstr->GetSrc2();
                if (src2)
                {
                    if (src2->IsRegOpnd() && src2->AsRegOpnd()->m_sym == stackSym)
                    {
                        lastInstr->HoistSrc2(Js::OpCode::Ld_A);
                    }
                }
            }
            this->ToVar(lastInstr, newOpnd, block, nullptr, false);
        }
        else
        {
            IR::Instr *lastNextInstr = lastInstr->m_next;
            this->ToVar(lastNextInstr, newOpnd, block, nullptr, false);
        }
    } NEXT_BITSET_IN_SPARSEBV;
}